

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogFile.cc
# Opt level: O2

void __thiscall tt::LogFile::append(LogFile *this,char *logline,int len)

{
  pthread_mutex_t *__mutex;
  MutexLockGuard lock;
  
  __mutex = (pthread_mutex_t *)
            (this->m_mutex)._M_t.
            super___uniq_ptr_impl<tt::MutexLock,_std::default_delete<tt::MutexLock>_>._M_t.
            super__Tuple_impl<0UL,_tt::MutexLock_*,_std::default_delete<tt::MutexLock>_>.
            super__Head_base<0UL,_tt::MutexLock_*,_false>._M_head_impl;
  if (__mutex != (pthread_mutex_t *)0x0) {
    pthread_mutex_lock(__mutex);
    append_unlocked(this,logline,len);
    pthread_mutex_unlock(__mutex);
    return;
  }
  append_unlocked(this,logline,len);
  return;
}

Assistant:

void tt::LogFile::append(const char* logline, int len){
	if(m_mutex){
		MutexLockGuard lock(*m_mutex);
		append_unlocked(logline,len);
	}else{
		append_unlocked(logline,len);
	}
}